

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O3

bool uuids::uuid::is_valid_uuid<wchar_t[37]>(wchar_t (*in_str) [37])

{
  wchar_t wVar1;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  sVar2 = wcslen(*in_str);
  if ((sVar2 == 0) ||
     (((bVar7 = (*in_str)[0] == L'{', bVar7 && (in_str[-1][sVar2 + 0x24] != L'}')) ||
      (uVar3 = (ulong)bVar7, sVar2 - uVar3 <= uVar3)))) {
LAB_0017161c:
    bVar7 = false;
  }
  else {
    bVar4 = 1;
    lVar5 = 0;
    uVar6 = 0;
    do {
      wVar1 = (*in_str)[uVar3 + lVar5];
      if (wVar1 != L'-') {
        if (0xf < uVar6) goto LAB_0017161c;
        if (9 < (uint)(wVar1 + L'\xffffffd0')) {
          if (0x25 < (uint)(wVar1 + L'\xffffffbf')) {
            return false;
          }
          if ((0x3f0000003fU >> ((ulong)(uint)(wVar1 + L'\xffffffbf') & 0x3f) & 1) == 0) {
            return false;
          }
        }
        bVar4 = ~bVar4 & 1;
        uVar6 = uVar6 + bVar4;
      }
      lVar5 = lVar5 + 1;
    } while (sVar2 - (uint)bVar7 * 2 != lVar5);
    bVar7 = 0xf < uVar6;
  }
  return bVar7;
}

Assistant:

[[nodiscard]] constexpr static bool is_valid_uuid(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         if (str.empty())
            return false;

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return false;

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return false;
            }

            if (firstDigit)
            {
               firstDigit = false;
            }
            else
            {
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return false;
         }

         return true;
      }